

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O1

int uv_async_init(uv_loop_t *loop,uv_async_t *handle,uv_async_cb async_cb)

{
  uint *puVar1;
  uint uVar2;
  uv__queue *puVar3;
  int fd;
  int *piVar4;
  int iVar5;
  
  iVar5 = 0;
  if ((loop->async_io_watcher).fd == -1) {
    iVar5 = 0;
    fd = eventfd(0,0x80800);
    if (fd < 0) {
      piVar4 = __errno_location();
      iVar5 = -*piVar4;
    }
    else {
      uv__io_init(&loop->async_io_watcher,uv__async_io,fd);
      uv__io_start(loop,&loop->async_io_watcher,1);
      loop->async_wfd = -1;
    }
  }
  if (iVar5 == 0) {
    handle->loop = loop;
    handle->type = UV_ASYNC;
    handle->flags = 8;
    (handle->handle_queue).next = &loop->handle_queue;
    puVar3 = (loop->handle_queue).prev;
    (handle->handle_queue).prev = puVar3;
    puVar3->next = &handle->handle_queue;
    (loop->handle_queue).prev = &handle->handle_queue;
    iVar5 = 0;
    handle->next_closing = (uv_handle_t *)0x0;
    handle->async_cb = async_cb;
    handle->busy = 0;
    handle->pending = 0;
    (handle->queue).next = &loop->async_handles;
    puVar3 = (loop->async_handles).prev;
    (handle->queue).prev = puVar3;
    puVar3->next = &handle->queue;
    (loop->async_handles).prev = &handle->queue;
    uVar2 = handle->flags;
    if (((uVar2 & 4) == 0) && (handle->flags = uVar2 | 4, (uVar2 & 8) != 0)) {
      puVar1 = &handle->loop->active_handles;
      *puVar1 = *puVar1 + 1;
    }
  }
  return iVar5;
}

Assistant:

int uv_async_init(uv_loop_t* loop, uv_async_t* handle, uv_async_cb async_cb) {
  int err;

  err = uv__async_start(loop);
  if (err)
    return err;

  uv__handle_init(loop, (uv_handle_t*)handle, UV_ASYNC);
  handle->async_cb = async_cb;
  handle->pending = 0;
  handle->busy = 0;

  uv__queue_insert_tail(&loop->async_handles, &handle->queue);
  uv__handle_start(handle);

  return 0;
}